

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O2

void interp1(double *x,double *y,int x_length,double *xi,int xi_length,double *yi)

{
  int i;
  void *pvVar1;
  int *index;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = x_length - 1;
  uVar3 = (ulong)uVar5 * 8;
  if (x_length < 1) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar1 = operator_new__(uVar3);
  uVar3 = (ulong)(uint)xi_length << 2;
  if (xi_length < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  index = (int *)operator_new__(uVar3);
  uVar2 = 0;
  uVar3 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    *(double *)((long)pvVar1 + uVar2 * 8) = x[uVar2 + 1] - x[uVar2];
  }
  uVar3 = 0;
  uVar2 = 0;
  if (0 < xi_length) {
    uVar2 = (ulong)(uint)xi_length;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    index[uVar3] = 0;
  }
  histc(x,x_length,xi,xi_length,index);
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    lVar4 = (long)index[uVar3];
    yi[uVar3] = (y[lVar4] - y[lVar4 + -1]) *
                ((xi[uVar3] - x[lVar4 + -1]) / *(double *)((long)pvVar1 + lVar4 * 8 + -8)) +
                y[lVar4 + -1];
  }
  operator_delete__(index);
  operator_delete__(pvVar1);
  return;
}

Assistant:

void interp1(const double *x, const double *y, int x_length, const double *xi,
    int xi_length, double *yi) {
  double *h = new double[x_length - 1];
  int *k = new int[xi_length];

  for (int i = 0; i < x_length - 1; ++i) h[i] = x[i + 1] - x[i];
  for (int i = 0; i < xi_length; ++i) {
    k[i] = 0;
  }

  histc(x, x_length, xi, xi_length, k);

  for (int i = 0; i < xi_length; ++i) {
    double s = (xi[i] - x[k[i] - 1]) / h[k[i] - 1];
    yi[i] = y[k[i] - 1] + s * (y[k[i]] - y[k[i] - 1]);
  }
  
  delete[] k;
  delete[] h;
}